

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void attr_merge_lists(attr_list list1,attr_list list2)

{
  attr_union value;
  int length;
  char *b;
  char *s;
  int c;
  int i;
  attr attr_guy;
  attr_list in_stack_ffffffffffffffb8;
  attr_value_type *in_stack_ffffffffffffffc0;
  atom_t *in_stack_ffffffffffffffc8;
  int index;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  
  length = attr_count(in_stack_ffffffffffffffb8);
  for (index = 0; index < length; index = index + 1) {
    get_pattr((attr_list)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),index,
              in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
              (attr_union *)in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffdc == 3) {
      in_stack_ffffffffffffffc8 = (atom_t *)strdup((char *)CONCAT44(uStack_1c,local_20));
      set_string_attr((attr_list)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),index
                      ,(char *)in_stack_ffffffffffffffc8);
    }
    else if (in_stack_ffffffffffffffdc == 4) {
      in_stack_ffffffffffffffc0 = (attr_value_type *)malloc((long)local_20);
      memcpy(in_stack_ffffffffffffffc0,local_18,(long)local_20);
      set_opaque_attr((attr_list)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),index
                      ,length,(char *)in_stack_ffffffffffffffc8);
    }
    else {
      value.u.o.buffer = in_stack_ffffffffffffffc8;
      value.u.p = in_stack_ffffffffffffffc0;
      set_pattr(in_stack_ffffffffffffffb8,0,0x104f51,value);
    }
  }
  return;
}

Assistant:

extern void
attr_merge_lists(attr_list list1, attr_list list2)
{
    attr attr_guy;
    int i;
    int c = attr_count(list2);
    /* need to make this more efficient */

    for (i = 0; i < c; i++) {
	get_pattr(list2, i, &attr_guy.attr_id, &attr_guy.val_type,
		  &attr_guy.value);
	if (attr_guy.val_type == Attr_String) {
	    char *s = strdup((char *) attr_guy.value.u.p);
	    set_string_attr(list1, attr_guy.attr_id, s);
        } else if (attr_guy.val_type == Attr_Opaque) {
            char *b = malloc(attr_guy.value.u.o.length);
            memcpy(b, attr_guy.value.u.o.buffer, attr_guy.value.u.o.length);
	    set_opaque_attr(list1, attr_guy.attr_id, attr_guy.value.u.o.length, b);
	} else {
	    set_pattr(list1, attr_guy.attr_id, attr_guy.val_type, attr_guy.value);
	}
    }
}